

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# preprocessing.c
# Opt level: O3

void expand_macro(token *macro_name,Source_File *src,Translation_Data *translation_data)

{
  undefined8 uVar1;
  undefined8 uVar2;
  void *pvVar3;
  Queue *args;
  int *piVar4;
  token *ptVar5;
  undefined8 *puVar6;
  undefined1 auVar7 [16];
  
  if (macro_name->type == KW_ID) {
    pvVar3 = Map_Check(translation_data->macros,macro_name->data,macro_name->data_size);
    if (pvVar3 != (void *)0x0) {
      free(macro_name);
      args = make_define_argument_list(*(size_t *)((long)pvVar3 + 0x18));
      load_macro_arguments(args,*(size_t *)((long)pvVar3 + 0x18),src,translation_data);
      if (translation_data->errors->size == 0) {
        for (puVar6 = (undefined8 *)**(undefined8 **)((long)pvVar3 + 8); puVar6 != (undefined8 *)0x0
            ; puVar6 = (undefined8 *)puVar6[1]) {
          ptVar5 = (token *)*puVar6;
          piVar4 = (int *)Map_Check(*(Map **)((long)pvVar3 + 0x10),ptVar5->data,ptVar5->data_size);
          if (piVar4 == (int *)0x0) {
            ptVar5 = copy_token(ptVar5);
            uVar1 = src->which_column;
            uVar2 = src->which_row;
            auVar7._8_4_ = (int)uVar1;
            auVar7._0_8_ = uVar2;
            auVar7._12_4_ = (int)((ulong)uVar1 >> 0x20);
            ptVar5->line = uVar2;
            ptVar5->column = auVar7._8_8_;
            Queue_Push(translation_data->tokens,ptVar5);
          }
          else {
            expand_macro_argument(args + *piVar4,src,translation_data);
          }
        }
      }
      delete_define_argument_list(*(size_t *)((long)pvVar3 + 0x18),args);
      return;
    }
  }
  Queue_Push(translation_data->tokens,macro_name);
  return;
}

Assistant:

void expand_macro(struct token* macro_name,struct Source_File *src,struct Translation_Data *translation_data)
{
	struct define_directive *hold=NULL;
	struct token *hold_token;
	int *index;
	struct Queue_Node *it;
	struct Queue *argument_list;

	if(macro_name->type==KW_ID)
		hold=Map_Check(translation_data->macros,macro_name->data,macro_name->data_size);
	if(hold!=NULL)
	{
		free(macro_name);
		argument_list=make_define_argument_list(hold->number_of_arguments);
		load_macro_arguments(argument_list,hold->number_of_arguments,src,translation_data);
		if(translation_data->errors->size>0)
		{
			delete_define_argument_list(hold->number_of_arguments,argument_list);
			return;
		}

		
		for(it=hold->macro_tokens->first;it!=NULL;it=it->prev)
		{
			hold_token=(struct token*)it->data;
			index=Map_Check(hold->arguments,hold_token->data,hold_token->data_size);
			if(index!=NULL)
			{
				expand_macro_argument(argument_list+*index,src,translation_data);
			}else
			{
				hold_token=copy_token(hold_token);

				hold_token->line=src->which_row;
				hold_token->column=src->which_column;

				Queue_Push(translation_data->tokens,hold_token);
			}
		}
		delete_define_argument_list(hold->number_of_arguments,argument_list);
	}else
	{
		/*this isn't a macro, so we just push it to the token queue*/
		Queue_Push(translation_data->tokens,macro_name);
	}
}